

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O1

ConstString * __thiscall Clasp::ConstString::operator=(ConstString *this,ConstString *rhs)

{
  int *piVar1;
  int *__ptr;
  RefCount *p;
  
  piVar1 = (int *)rhs->ref_;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  __ptr = (int *)this->ref_;
  this->ref_ = (RefType)piVar1;
  if (__ptr != (int *)0x0) {
    LOCK();
    *__ptr = *__ptr + -1;
    UNLOCK();
    if (*__ptr == 0) {
      free(__ptr);
    }
  }
  return this;
}

Assistant:

ConstString& ConstString::operator=(const ConstString& rhs) {
	ConstString temp(rhs);
	swap(temp);
	return *this;
}